

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::Normalizer2Impl::ensureCanonIterData(Normalizer2Impl *this,UErrorCode *errorCode)

{
  UInitOnce *uio;
  UErrorCode UVar1;
  UBool UVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uio = &this->fCanonIterDataInitOnce;
    if ((uio->fState).super___atomic_base<int>._M_i != 2) {
      UVar2 = umtx_initImplPreInit(uio);
      if (UVar2 != '\0') {
        InitCanonIterData::doInit(this,errorCode);
        (this->fCanonIterDataInitOnce).fErrCode = *errorCode;
        umtx_initImplPostInit(uio);
        goto LAB_00295191;
      }
    }
    UVar1 = (this->fCanonIterDataInitOnce).fErrCode;
    if (U_ZERO_ERROR < UVar1) {
      *errorCode = UVar1;
    }
  }
LAB_00295191:
  return *errorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

UBool Normalizer2Impl::ensureCanonIterData(UErrorCode &errorCode) const {
    // Logically const: Synchronized instantiation.
    Normalizer2Impl *me=const_cast<Normalizer2Impl *>(this);
    umtx_initOnce(me->fCanonIterDataInitOnce, &initCanonIterData, me, errorCode);
    return U_SUCCESS(errorCode);
}